

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_octet_string(uchar **p,uchar *start,uchar *buf,size_t size)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  if ((ulong)((long)puVar1 - (long)start) < size || puVar1 < start) {
    size = 0xffffffffffffff94;
  }
  else {
    *p = puVar1 + -size;
    switchD_00916250::default(puVar1 + -size,buf,size);
    if (-1 < (int)(uint)size) {
      iVar2 = mbedtls_asn1_write_len_and_tag(p,start,(ulong)((uint)size & 0x7fffffff),'\x04');
      return iVar2;
    }
  }
  return (int)size;
}

Assistant:

int mbedtls_asn1_write_octet_string(unsigned char **p, const unsigned char *start,
                                    const unsigned char *buf, size_t size)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start, buf, size));

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_OCTET_STRING);
}